

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O3

Fraction * __thiscall Fraction::operator-=(Fraction *this,Fraction *b)

{
  uint __n;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  uVar1 = this->denominator_;
  uVar4 = b->denominator_;
  iVar2 = 0;
  if (uVar4 != 0 && uVar1 != 0) {
    __n = -uVar4;
    if (0 < (int)uVar4) {
      __n = uVar4;
    }
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar1 = std::__detail::__gcd<unsigned_int>(uVar4,__n);
    iVar2 = (uVar4 / uVar1) * __n;
    uVar1 = this->denominator_;
    uVar4 = b->denominator_;
  }
  iVar3 = (iVar2 / (int)uVar1) * this->numerator_;
  this->numerator_ = iVar3;
  this->numerator_ = iVar3 - (iVar2 / (int)uVar4) * b->numerator_;
  this->denominator_ = iVar2;
  Normalization(this);
  return this;
}

Assistant:

const Fraction& Fraction::operator-=(const Fraction& b) {
  int current_lcm = std::lcm(denominator_, b.denominator_);
  numerator_ *= current_lcm / denominator_;
  numerator_ -= b.numerator_ * (current_lcm / b.denominator_);
  denominator_ = current_lcm;
  Normalization();
  return *this;
}